

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_string.cpp
# Opt level: O3

sc_string_old __thiscall sc_dt::sc_string_old::operator+(sc_string_old *this,sc_string_old *s)

{
  char *__s;
  char *__s_00;
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  size_t sVar5;
  sc_string_rep *r;
  size_t sVar6;
  char *__dest;
  int iVar7;
  long *in_RDX;
  
  __s = s->rep->str;
  sVar5 = strlen(__s);
  r = (sc_string_rep *)operator_new(0x10);
  __s_00 = *(char **)(*in_RDX + 8);
  sVar6 = strlen(__s_00);
  iVar1 = (int)sVar5;
  uVar3 = (int)sVar6 + iVar1;
  uVar2 = (int)sVar6 + iVar1 + 0xf;
  if (-1 < (int)uVar3) {
    uVar2 = uVar3;
  }
  r->ref_count = 1;
  iVar7 = (uVar2 & 0xfffffff0) + 0x10;
  r->alloc = iVar7;
  iVar4 = -1;
  if (-1 < iVar7) {
    iVar4 = iVar7;
  }
  __dest = (char *)operator_new__((long)iVar4);
  r->str = __dest;
  *__dest = '\0';
  strcpy(__dest,__s);
  strcpy(__dest + iVar1,__s_00);
  sc_string_old(this,r);
  return (sc_string_old)(sc_string_rep *)this;
}

Assistant:

sc_string_old
sc_string_old::operator+( const sc_string_old& s ) const
{
    int len = length();
    sc_string_rep* r = new sc_string_rep( len + s.length() + 1 );
    strcpy( r->str, rep->str );
    strcpy( r->str + len, s.rep->str );
    return sc_string_old(r);
}